

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

void it_xm_fixup_sample_points(IT_SAMPLE *sample)

{
  IT_SAMPLE *sample_local;
  
  if ((sample->flags & 2) != 0) {
    sample->length = sample->length >> 1;
    sample->loop_start = sample->loop_start >> 1;
    sample->loop_end = sample->loop_end >> 1;
  }
  if ((sample->flags & 4) != 0) {
    sample->length = sample->length >> 1;
    sample->loop_start = sample->loop_start >> 1;
    sample->loop_end = sample->loop_end >> 1;
  }
  if ((uint)sample->length < (uint)sample->loop_end) {
    sample->flags = sample->flags & 0xef;
  }
  else if ((uint)sample->loop_end <= (uint)sample->loop_start) {
    sample->flags = sample->flags & 0xef;
  }
  return;
}

Assistant:

static void it_xm_fixup_sample_points(IT_SAMPLE *sample)
{
	if (sample->flags & IT_SAMPLE_16BIT) {
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}
	if (sample->flags & IT_SAMPLE_STEREO) {
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}

	if ((unsigned int)sample->loop_end > (unsigned int)sample->length)
		sample->flags &= ~IT_SAMPLE_LOOP;
	else if ((unsigned int)sample->loop_start >= (unsigned int)sample->loop_end)
		sample->flags &= ~IT_SAMPLE_LOOP;
}